

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqllogictest.cpp
# Opt level: O2

void listFiles(FileSystem *fs,string *path,
              function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *cb)

{
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  local_28 = (code *)0x0;
  pcStack_20 = (code *)0x0;
  local_38._M_unused._M_object = (void *)0x0;
  local_38._8_8_ = 0;
  local_38._M_unused._M_object = operator_new(0x18);
  *(FileSystem **)local_38._M_unused._0_8_ = fs;
  *(string **)((long)local_38._M_unused._0_8_ + 8) = path;
  *(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    **)((long)local_38._M_unused._0_8_ + 0x10) = cb;
  pcStack_20 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sqlite/test_sqllogictest.cpp:19:21)>
               ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/test/sqlite/test_sqllogictest.cpp:19:21)>
             ::_M_manager;
  (**(code **)(*(long *)fs + 0x88))(fs,path,&local_38,0);
  Catch::clara::std::_Function_base::~_Function_base((_Function_base *)&local_38);
  return;
}

Assistant:

static void listFiles(FileSystem &fs, const string &path, std::function<void(const string &)> cb) {
	fs.ListFiles(path, [&](string fname, bool is_dir) {
		string full_path = fs.JoinPath(path, fname);
		if (is_dir) {
			// recurse into directory
			listFiles(fs, full_path, cb);
		} else {
			cb(full_path);
		}
	});
}